

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
Publisher(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
                *topics)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  pointer pcVar4;
  mapped_type *pmVar5;
  pointer __x;
  key_type local_50;
  
  this->_vptr_Publisher = (_func_int **)&PTR___cxa_pure_virtual_0010bd10;
  Publisher<std::__cxx11::string*>::get_counter()::counter =
       Publisher<std::__cxx11::string*>::get_counter()::counter + 1;
  this->id = Publisher<std::__cxx11::string*>::get_counter()::counter;
  p_Var1 = &(this->m_reverse)._M_t._M_impl.super__Rb_tree_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_signals)._M_t._M_impl.super__Rb_tree_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_reverse)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_topics).
  super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_signals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  __x = (topics->
        super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (topics->
           super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != psVar2) {
    do {
      peVar3 = (__x->
               super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      pcVar4 = (peVar3->_name)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + (peVar3->_name)._M_string_length);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
               ::operator[](&this->m_reverse,&local_50);
      (pmVar5->
      super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (__x->
                 super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar5->
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,
                 &(__x->
                  super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
      attach((__x->
             super___shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr,this);
      std::
      vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
      ::push_back(&this->m_topics,__x);
      __x = __x + 1;
    } while (__x != psVar2);
  }
  return;
}

Assistant:

Publisher(const std::vector<topic_ptr_t<T>>& topics)
		: id{get_counter()}
		{
			for (auto& t : topics)
			{
				m_reverse[t->get_name()] = t;
				t->attach(this);
				m_topics.push_back(t);
			}
		}